

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_pipe.cpp
# Opt level: O3

void just_test_test_case_f_test_pipe_write_and_read(void)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  size_t in_RCX;
  void *__buf;
  int __fd;
  ulong uVar3;
  pipe p;
  assert_equal local_a0;
  input_file local_74;
  output_file local_6c;
  long *local_68;
  long local_60;
  long local_58 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  int local_28 [2];
  _Alloc_hider _Var2;
  
  pipe(local_28);
  local_74._fd = local_28[0];
  local_74._eof = false;
  paVar1 = &local_a0._assert_msg._filename.field_2;
  local_a0._assert_msg._filename._M_dataplus._M_p = (pointer)paVar1;
  local_6c._fd = local_28[1];
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a0,"Hello","");
  _Var2._M_p = local_a0._assert_msg._filename._M_dataplus._M_p;
  write(local_28[1],local_a0._assert_msg._filename._M_dataplus._M_p,
        local_a0._assert_msg._filename._M_string_length);
  __fd = (int)_Var2._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._assert_msg._filename._M_dataplus._M_p != paVar1) {
    uVar3 = local_a0._assert_msg._filename.field_2._M_allocated_capacity + 1;
    operator_delete(local_a0._assert_msg._filename._M_dataplus._M_p,uVar3);
    __fd = (int)uVar3;
  }
  just::process::impl::output_file::close(&local_6c,__fd);
  local_68 = local_58;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_68,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/sabel83[P]just/libs/process/test/test_pipe.cpp"
             ,"");
  local_a0._assert_msg._filename._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>((string *)&local_a0,local_68,local_60 + (long)local_68);
  local_a0._assert_msg._line = 0x18;
  just::process::impl::input_file::read_abi_cxx11_
            ((input_file *)&local_48,(int)&local_74,__buf,in_RCX);
  just::test::assert_equal::operator()(&local_a0,"Hello",&local_48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._assert_msg._filename._M_dataplus._M_p != paVar1) {
    operator_delete(local_a0._assert_msg._filename._M_dataplus._M_p,
                    local_a0._assert_msg._filename.field_2._M_allocated_capacity + 1);
  }
  if (local_68 != local_58) {
    operator_delete(local_68,local_58[0] + 1);
  }
  just::process::impl::output_file::~output_file(&local_6c);
  just::process::impl::input_file::~input_file(&local_74);
  return;
}

Assistant:

JUST_TEST_CASE(test_pipe_write_and_read)
{
  just::process::impl::pipe p;
  p.output.write("Hello");
  p.output.close();

  JUST_ASSERT_EQUAL("Hello", p.input.read());
}